

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx::InstanceISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,InstanceISA *this,PrimRef *prims,range<unsigned_long> *r
          ,size_t k,uint geomID)

{
  AffineSpace3ff *pAVar1;
  long lVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined4 uVar6;
  PrimInfo *pinfo;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  float fVar9;
  float fVar12;
  float fVar13;
  undefined1 auVar10 [16];
  float fVar14;
  undefined1 auVar11 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar29;
  float fVar33;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar34;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar35 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar50;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  
  aVar7.m128[2] = INFINITY;
  aVar7._0_8_ = 0x7f8000007f800000;
  aVar7.m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar7;
  aVar8.m128[2] = -INFINITY;
  aVar8._0_8_ = 0xff800000ff800000;
  aVar8.m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar8;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar7;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar8;
  auVar10 = ZEXT816(0) << 0x40;
  __return_storage_ptr__->begin = auVar10._0_8_;
  __return_storage_ptr__->end = auVar10._8_8_;
  pAVar1 = (this->super_Instance).local2world;
  if ((this->super_Instance).super_Geometry.field_8.field_0x1 == '\x01') {
    fVar20 = (pAVar1->p).field_0.m128[3];
    fVar29 = (pAVar1->l).vx.field_0.m128[3];
    fVar33 = (pAVar1->l).vy.field_0.m128[3];
    fVar9 = (pAVar1->l).vz.field_0.m128[3];
    fVar12 = fVar29 * fVar33 + fVar20 * fVar9;
    fVar15 = fVar29 * fVar33 - fVar20 * fVar9;
    fVar17 = fVar20 * fVar20 - fVar29 * fVar29;
    fVar18 = fVar29 * fVar9 - fVar20 * fVar33;
    fVar13 = fVar29 * fVar9 + fVar20 * fVar33;
    fVar14 = fVar33 * fVar9 + fVar29 * fVar20;
    fVar19 = fVar33 * fVar9 - fVar29 * fVar20;
    auVar51 = ZEXT416((uint)(-fVar9 * fVar9 + -fVar33 * fVar33 + fVar20 * fVar20 + fVar29 * fVar29))
    ;
    auVar51 = vshufps_avx(auVar51,auVar51,0);
    auVar31 = ZEXT416((uint)(fVar12 + fVar12));
    auVar31 = vshufps_avx(auVar31,auVar31,0);
    auVar25 = ZEXT416((uint)(fVar18 + fVar18));
    auVar25 = vshufps_avx(auVar25,auVar25,0);
    fVar16 = auVar51._0_4_ * 1.0 + auVar25._0_4_ * 0.0 + auVar31._0_4_ * 0.0;
    fVar21 = auVar51._4_4_ * 0.0 + auVar25._4_4_ * 0.0 + auVar31._4_4_ * 1.0;
    fVar26 = auVar51._8_4_ * 0.0 + auVar25._8_4_ * 1.0 + auVar31._8_4_ * 0.0;
    fVar27 = auVar51._12_4_ * 0.0 + auVar25._12_4_ * 0.0 + auVar31._12_4_ * 0.0;
    auVar51 = ZEXT416((uint)(-fVar9 * fVar9 + fVar33 * fVar33 + fVar17));
    auVar51 = vshufps_avx(auVar51,auVar51,0);
    auVar31 = ZEXT416((uint)(fVar14 + fVar14));
    auVar31 = vshufps_avx(auVar31,auVar31,0);
    auVar10 = vshufps_avx((undefined1  [16])(pAVar1->l).vx.field_0,auVar10,0xe9);
    auVar10 = vblendps_avx(auVar10,(undefined1  [16])(pAVar1->l).vy.field_0,4);
    auVar25 = ZEXT416((uint)(fVar15 + fVar15));
    auVar25 = vshufps_avx(auVar25,auVar25,0);
    fVar28 = auVar25._0_4_ * 1.0 + auVar51._0_4_ * 0.0 + auVar31._0_4_ * 0.0;
    fVar44 = auVar25._4_4_ * 0.0 + auVar51._4_4_ * 1.0 + auVar31._4_4_ * 0.0;
    fVar47 = auVar25._8_4_ * 0.0 + auVar51._8_4_ * 0.0 + auVar31._8_4_ * 1.0;
    fVar48 = auVar25._12_4_ * 0.0 + auVar51._12_4_ * 0.0 + auVar31._12_4_ * 0.0;
    auVar51 = ZEXT416((uint)(fVar13 + fVar13));
    auVar51 = vshufps_avx(auVar51,auVar51,0);
    auVar31 = ZEXT416((uint)(fVar19 + fVar19));
    auVar31 = vshufps_avx(auVar31,auVar31,0);
    auVar25 = ZEXT416((uint)(fVar9 * fVar9 + fVar17 + -fVar33 * fVar33));
    auVar25 = vshufps_avx(auVar25,auVar25,0);
    fVar49 = auVar51._0_4_ * 1.0 + auVar31._0_4_ * 0.0 + auVar25._0_4_ * 0.0;
    fVar34 = auVar51._4_4_ * 0.0 + auVar31._4_4_ * 1.0 + auVar25._4_4_ * 0.0;
    fVar36 = auVar51._8_4_ * 0.0 + auVar31._8_4_ * 0.0 + auVar25._8_4_ * 1.0;
    fVar37 = auVar51._12_4_ * 0.0 + auVar31._12_4_ * 0.0 + auVar25._12_4_ * 0.0;
    fVar20 = (pAVar1->l).vx.field_0.m128[0];
    fVar9 = fVar20 * fVar16 + fVar49 * 0.0 + fVar28 * 0.0;
    fVar12 = fVar20 * fVar21 + fVar34 * 0.0 + fVar44 * 0.0;
    fVar13 = fVar20 * fVar26 + fVar36 * 0.0 + fVar47 * 0.0;
    fVar14 = fVar20 * fVar27 + fVar37 * 0.0 + fVar48 * 0.0;
    fVar20 = (pAVar1->l).vy.field_0.m128[0];
    fVar29 = (pAVar1->l).vy.field_0.m128[1];
    fVar15 = fVar29 * fVar28 + fVar49 * 0.0 + fVar20 * fVar16;
    fVar17 = fVar29 * fVar44 + fVar34 * 0.0 + fVar20 * fVar21;
    fVar18 = fVar29 * fVar47 + fVar36 * 0.0 + fVar20 * fVar26;
    fVar19 = fVar29 * fVar48 + fVar37 * 0.0 + fVar20 * fVar27;
    fVar20 = (pAVar1->l).vz.field_0.m128[0];
    fVar29 = (pAVar1->l).vz.field_0.m128[1];
    fVar33 = (pAVar1->l).vz.field_0.m128[2];
    fVar38 = fVar20 * fVar16 + fVar29 * fVar28 + fVar33 * fVar49;
    fVar40 = fVar20 * fVar21 + fVar29 * fVar44 + fVar33 * fVar34;
    fVar41 = fVar20 * fVar26 + fVar29 * fVar47 + fVar33 * fVar36;
    fVar42 = fVar20 * fVar27 + fVar29 * fVar48 + fVar33 * fVar37;
    fVar20 = (pAVar1->p).field_0.m128[0];
    fVar29 = (pAVar1->p).field_0.m128[1];
    fVar33 = (pAVar1->p).field_0.m128[2];
    fVar16 = auVar10._0_4_ + 0.0 + fVar20 * fVar16 + fVar29 * fVar28 + fVar33 * fVar49;
    fVar21 = auVar10._4_4_ + 0.0 + fVar20 * fVar21 + fVar29 * fVar44 + fVar33 * fVar34;
    fVar26 = auVar10._8_4_ + 0.0 + fVar20 * fVar26 + fVar29 * fVar47 + fVar33 * fVar36;
    fVar20 = auVar10._12_4_ + 0.0 + fVar20 * fVar27 + fVar29 * fVar48 + fVar33 * fVar37;
    lVar2 = *(long *)&(this->super_Instance).super_Geometry.field_0x58;
    auVar51 = vminps_avx(*(undefined1 (*) [16])(lVar2 + 0x10),*(undefined1 (*) [16])(lVar2 + 0x30));
    auVar10 = vmaxps_avx(*(undefined1 (*) [16])(lVar2 + 0x20),*(undefined1 (*) [16])(lVar2 + 0x40));
    auVar31 = vshufps_avx(auVar51,auVar51,0);
    auVar25 = vshufps_avx(auVar51,auVar51,0x55);
    auVar51 = vshufps_avx(auVar51,auVar51,0xaa);
    fVar29 = fVar38 * auVar51._0_4_ + fVar16;
    fVar33 = fVar40 * auVar51._4_4_ + fVar21;
    fVar27 = fVar41 * auVar51._8_4_ + fVar26;
    fVar28 = fVar42 * auVar51._12_4_ + fVar20;
    fVar34 = auVar25._0_4_ * fVar15;
    fVar36 = auVar25._4_4_ * fVar17;
    fVar37 = auVar25._8_4_ * fVar18;
    fVar43 = auVar25._12_4_ * fVar19;
    fVar50 = fVar34 + fVar29;
    fVar52 = fVar36 + fVar33;
    fVar53 = fVar37 + fVar27;
    fVar54 = fVar43 + fVar28;
    fVar44 = auVar31._0_4_ * fVar9;
    fVar47 = auVar31._4_4_ * fVar12;
    fVar48 = auVar31._8_4_ * fVar13;
    fVar49 = auVar31._12_4_ * fVar14;
    auVar51._0_4_ = fVar50 + fVar44;
    auVar51._4_4_ = fVar52 + fVar47;
    auVar51._8_4_ = fVar53 + fVar48;
    auVar51._12_4_ = fVar54 + fVar49;
    auVar25 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar31 = vminps_avx((undefined1  [16])aVar7,auVar51);
    auVar51 = vmaxps_avx((undefined1  [16])aVar8,auVar51);
    fVar16 = fVar38 * auVar25._0_4_ + fVar16;
    fVar21 = fVar40 * auVar25._4_4_ + fVar21;
    fVar26 = fVar41 * auVar25._8_4_ + fVar26;
    fVar20 = fVar42 * auVar25._12_4_ + fVar20;
    fVar34 = fVar34 + fVar16;
    fVar36 = fVar36 + fVar21;
    fVar37 = fVar37 + fVar26;
    fVar43 = fVar43 + fVar20;
    auVar46._0_4_ = fVar34 + fVar44;
    auVar46._4_4_ = fVar36 + fVar47;
    auVar46._8_4_ = fVar37 + fVar48;
    auVar46._12_4_ = fVar43 + fVar49;
    auVar31 = vminps_avx(auVar31,auVar46);
    auVar51 = vmaxps_avx(auVar51,auVar46);
    auVar25 = vshufps_avx(auVar10,auVar10,0x55);
    fVar15 = auVar25._0_4_ * fVar15;
    fVar17 = auVar25._4_4_ * fVar17;
    fVar18 = auVar25._8_4_ * fVar18;
    fVar19 = auVar25._12_4_ * fVar19;
    fVar29 = fVar29 + fVar15;
    fVar33 = fVar33 + fVar17;
    fVar27 = fVar27 + fVar18;
    fVar28 = fVar28 + fVar19;
    auVar57._0_4_ = fVar44 + fVar29;
    auVar57._4_4_ = fVar47 + fVar33;
    auVar57._8_4_ = fVar48 + fVar27;
    auVar57._12_4_ = fVar49 + fVar28;
    auVar31 = vminps_avx(auVar31,auVar57);
    auVar51 = vmaxps_avx(auVar51,auVar57);
    fVar15 = fVar15 + fVar16;
    fVar17 = fVar17 + fVar21;
    fVar18 = fVar18 + fVar26;
    fVar19 = fVar19 + fVar20;
    auVar25._0_4_ = fVar44 + fVar15;
    auVar25._4_4_ = fVar47 + fVar17;
    auVar25._8_4_ = fVar48 + fVar18;
    auVar25._12_4_ = fVar49 + fVar19;
    auVar31 = vminps_avx(auVar31,auVar25);
    auVar51 = vmaxps_avx(auVar51,auVar25);
    auVar10 = vshufps_avx(auVar10,auVar10,0);
    fVar9 = fVar9 * auVar10._0_4_;
    fVar12 = fVar12 * auVar10._4_4_;
    fVar13 = fVar13 * auVar10._8_4_;
    fVar14 = fVar14 * auVar10._12_4_;
    auVar10._0_4_ = fVar50 + fVar9;
    auVar10._4_4_ = fVar52 + fVar12;
    auVar10._8_4_ = fVar53 + fVar13;
    auVar10._12_4_ = fVar54 + fVar14;
    auVar31 = vminps_avx(auVar31,auVar10);
    auVar10 = vmaxps_avx(auVar51,auVar10);
    auVar35._0_4_ = fVar34 + fVar9;
    auVar35._4_4_ = fVar36 + fVar12;
    auVar35._8_4_ = fVar37 + fVar13;
    auVar35._12_4_ = fVar43 + fVar14;
    auVar51 = vminps_avx(auVar31,auVar35);
    auVar10 = vmaxps_avx(auVar10,auVar35);
    auVar31._0_4_ = fVar9 + fVar29;
    auVar31._4_4_ = fVar12 + fVar33;
    auVar31._8_4_ = fVar13 + fVar27;
    auVar31._12_4_ = fVar14 + fVar28;
  }
  else {
    fVar9 = (pAVar1->l).vx.field_0.m128[0];
    fVar12 = (pAVar1->l).vx.field_0.m128[1];
    fVar13 = (pAVar1->l).vx.field_0.m128[2];
    fVar14 = (pAVar1->l).vx.field_0.m128[3];
    fVar15 = (pAVar1->l).vy.field_0.m128[0];
    fVar17 = (pAVar1->l).vy.field_0.m128[1];
    fVar18 = (pAVar1->l).vy.field_0.m128[2];
    fVar19 = (pAVar1->l).vy.field_0.m128[3];
    fVar20 = (pAVar1->l).vz.field_0.m128[0];
    fVar29 = (pAVar1->l).vz.field_0.m128[1];
    fVar33 = (pAVar1->l).vz.field_0.m128[2];
    fVar16 = (pAVar1->l).vz.field_0.m128[3];
    fVar21 = (pAVar1->p).field_0.m128[0];
    fVar26 = (pAVar1->p).field_0.m128[1];
    fVar27 = (pAVar1->p).field_0.m128[2];
    fVar28 = (pAVar1->p).field_0.m128[3];
    lVar2 = *(long *)&(this->super_Instance).super_Geometry.field_0x58;
    auVar51 = vminps_avx(*(undefined1 (*) [16])(lVar2 + 0x10),*(undefined1 (*) [16])(lVar2 + 0x30));
    auVar10 = vmaxps_avx(*(undefined1 (*) [16])(lVar2 + 0x20),*(undefined1 (*) [16])(lVar2 + 0x40));
    auVar31 = vshufps_avx(auVar51,auVar51,0);
    auVar25 = vshufps_avx(auVar51,auVar51,0x55);
    auVar51 = vshufps_avx(auVar51,auVar51,0xaa);
    fVar34 = fVar21 + fVar20 * auVar51._0_4_;
    fVar36 = fVar26 + fVar29 * auVar51._4_4_;
    fVar37 = fVar27 + fVar33 * auVar51._8_4_;
    fVar38 = fVar28 + fVar16 * auVar51._12_4_;
    fVar44 = auVar25._0_4_ * fVar15;
    fVar47 = auVar25._4_4_ * fVar17;
    fVar48 = auVar25._8_4_ * fVar18;
    fVar49 = auVar25._12_4_ * fVar19;
    fVar50 = fVar44 + fVar34;
    fVar52 = fVar47 + fVar36;
    fVar53 = fVar48 + fVar37;
    fVar54 = fVar49 + fVar38;
    fVar40 = auVar31._0_4_ * fVar9;
    fVar41 = auVar31._4_4_ * fVar12;
    fVar42 = auVar31._8_4_ * fVar13;
    fVar43 = auVar31._12_4_ * fVar14;
    auVar55._0_4_ = fVar40 + fVar50;
    auVar55._4_4_ = fVar41 + fVar52;
    auVar55._8_4_ = fVar42 + fVar53;
    auVar55._12_4_ = fVar43 + fVar54;
    auVar31 = vminps_avx((undefined1  [16])aVar7,auVar55);
    auVar51 = vmaxps_avx((undefined1  [16])aVar8,auVar55);
    auVar25 = vshufps_avx(auVar10,auVar10,0xaa);
    fVar21 = fVar21 + auVar25._0_4_ * fVar20;
    fVar26 = fVar26 + auVar25._4_4_ * fVar29;
    fVar27 = fVar27 + auVar25._8_4_ * fVar33;
    fVar28 = fVar28 + auVar25._12_4_ * fVar16;
    fVar44 = fVar44 + fVar21;
    fVar47 = fVar47 + fVar26;
    fVar48 = fVar48 + fVar27;
    fVar49 = fVar49 + fVar28;
    auVar45._0_4_ = fVar40 + fVar44;
    auVar45._4_4_ = fVar41 + fVar47;
    auVar45._8_4_ = fVar42 + fVar48;
    auVar45._12_4_ = fVar43 + fVar49;
    auVar31 = vminps_avx(auVar31,auVar45);
    auVar51 = vmaxps_avx(auVar51,auVar45);
    auVar25 = vshufps_avx(auVar10,auVar10,0x55);
    fVar15 = auVar25._0_4_ * fVar15;
    fVar17 = auVar25._4_4_ * fVar17;
    fVar18 = auVar25._8_4_ * fVar18;
    fVar19 = auVar25._12_4_ * fVar19;
    fVar34 = fVar34 + fVar15;
    fVar36 = fVar36 + fVar17;
    fVar37 = fVar37 + fVar18;
    fVar38 = fVar38 + fVar19;
    auVar56._0_4_ = fVar40 + fVar34;
    auVar56._4_4_ = fVar41 + fVar36;
    auVar56._8_4_ = fVar42 + fVar37;
    auVar56._12_4_ = fVar43 + fVar38;
    auVar31 = vminps_avx(auVar31,auVar56);
    auVar51 = vmaxps_avx(auVar51,auVar56);
    fVar15 = fVar15 + fVar21;
    fVar17 = fVar17 + fVar26;
    fVar18 = fVar18 + fVar27;
    fVar19 = fVar19 + fVar28;
    auVar22._0_4_ = fVar40 + fVar15;
    auVar22._4_4_ = fVar41 + fVar17;
    auVar22._8_4_ = fVar42 + fVar18;
    auVar22._12_4_ = fVar43 + fVar19;
    auVar31 = vminps_avx(auVar31,auVar22);
    auVar51 = vmaxps_avx(auVar51,auVar22);
    auVar10 = vshufps_avx(auVar10,auVar10,0);
    fVar9 = fVar9 * auVar10._0_4_;
    fVar12 = fVar12 * auVar10._4_4_;
    fVar13 = fVar13 * auVar10._8_4_;
    fVar14 = fVar14 * auVar10._12_4_;
    auVar39._0_4_ = fVar50 + fVar9;
    auVar39._4_4_ = fVar52 + fVar12;
    auVar39._8_4_ = fVar53 + fVar13;
    auVar39._12_4_ = fVar54 + fVar14;
    auVar31 = vminps_avx(auVar31,auVar39);
    auVar10 = vmaxps_avx(auVar51,auVar39);
    auVar30._0_4_ = fVar9 + fVar44;
    auVar30._4_4_ = fVar12 + fVar47;
    auVar30._8_4_ = fVar13 + fVar48;
    auVar30._12_4_ = fVar14 + fVar49;
    auVar51 = vminps_avx(auVar31,auVar30);
    auVar10 = vmaxps_avx(auVar10,auVar30);
    auVar31._0_4_ = fVar9 + fVar34;
    auVar31._4_4_ = fVar12 + fVar36;
    auVar31._8_4_ = fVar13 + fVar37;
    auVar31._12_4_ = fVar14 + fVar38;
  }
  auVar51 = vminps_avx(auVar51,auVar31);
  auVar10 = vmaxps_avx(auVar10,auVar31);
  auVar11._0_4_ = fVar9 + fVar15;
  auVar11._4_4_ = fVar12 + fVar17;
  auVar11._8_4_ = fVar13 + fVar18;
  auVar11._12_4_ = fVar14 + fVar19;
  auVar25 = vminps_avx(auVar51,auVar11);
  auVar31 = vmaxps_avx(auVar10,auVar11);
  auVar23._8_4_ = 0xddccb9a2;
  auVar23._0_8_ = 0xddccb9a2ddccb9a2;
  auVar23._12_4_ = 0xddccb9a2;
  auVar10 = vcmpps_avx(auVar25,auVar23,6);
  auVar32._8_4_ = 0x5dccb9a2;
  auVar32._0_8_ = 0x5dccb9a25dccb9a2;
  auVar32._12_4_ = 0x5dccb9a2;
  auVar51 = vcmpps_avx(auVar31,auVar32,1);
  auVar10 = vandps_avx(auVar10,auVar51);
  uVar6 = vmovmskps_avx(auVar10);
  if ((~(byte)uVar6 & 7) == 0) {
    aVar4 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(auVar25,ZEXT416(geomID),0x30);
    aVar3 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vblendps_avx(auVar31,ZEXT816(0),8);
    aVar5.m128 = (__m128)vminps_avx(aVar7.m128,(undefined1  [16])aVar4);
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = aVar5;
    aVar5.m128 = (__m128)vmaxps_avx(aVar8.m128,(undefined1  [16])aVar3);
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = aVar5;
    auVar24._0_4_ = aVar3.x + aVar4.x;
    auVar24._4_4_ = aVar3.y + aVar4.y;
    auVar24._8_4_ = aVar3.z + aVar4.z;
    auVar24._12_4_ = aVar3.field_3.w + aVar4.field_3.w;
    aVar7.m128 = (__m128)vminps_avx(aVar7.m128,auVar24);
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = aVar7;
    aVar7.m128 = (__m128)vmaxps_avx(aVar8.m128,auVar24);
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = aVar7;
    __return_storage_ptr__->end = 1;
    prims[k].upper.field_0.field_1 = aVar3;
    prims[k].lower.field_0.field_1 = aVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        assert(r.begin() == 0);
        assert(r.end()   == 1);

        PrimInfo pinfo(empty);
        BBox3fa b = empty;
        if (!buildBounds(0,&b)) return pinfo;
        // const BBox3fa b = bounds(0);
        // if (!isvalid(b)) return pinfo;

        const PrimRef prim(b,geomID,unsigned(0));
        pinfo.add_center2(prim);
        prims[k++] = prim;
        return pinfo;
      }